

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall
CCoinsViewMemPool::PackageAddTransaction(CCoinsViewMemPool *this,CTransactionRef *tx)

{
  element_type *peVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  int local_9c;
  CTxOut local_98;
  undefined4 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  while( true ) {
    local_9c = (int)uVar3;
    peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    lVar2 = (long)(peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((ulong)(lVar2 / 0x28) <= uVar3) break;
    local_68 = *(undefined8 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    uStack_60 = *(undefined8 *)
                 ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    local_58 = *(undefined8 *)
                ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    uStack_50 = *(undefined8 *)
                 ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    local_48 = local_9c;
    CTxOut::CTxOut(&local_98,
                   (peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar3);
    local_70 = 0xfffffffe;
    std::
    _Hashtable<COutPoint,std::pair<COutPoint_const,Coin>,std::allocator<std::pair<COutPoint_const,Coin>>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<COutPoint,Coin>
              ((_Hashtable<COutPoint,std::pair<COutPoint_const,Coin>,std::allocator<std::pair<COutPoint_const,Coin>>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->m_temp_added,&local_68,&local_98);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&local_98.scriptPubKey.super_CScriptBase);
    std::
    _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<transaction_identifier<false>const&,unsigned_int&>
              ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->m_non_base_coins,
               &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                hash,&local_9c);
    uVar3 = (ulong)(local_9c + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail(peVar1,uVar3,lVar2 % 0x28);
}

Assistant:

void CCoinsViewMemPool::PackageAddTransaction(const CTransactionRef& tx)
{
    for (unsigned int n = 0; n < tx->vout.size(); ++n) {
        m_temp_added.emplace(COutPoint(tx->GetHash(), n), Coin(tx->vout[n], MEMPOOL_HEIGHT, false));
        m_non_base_coins.emplace(tx->GetHash(), n);
    }
}